

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

int KYBER_parse_public_key(KYBER_public_key *public_key,CBS *in)

{
  int iVar1;
  size_t sVar2;
  uint8_t *out;
  uint8_t *in_00;
  undefined1 local_38 [8];
  CBS orig_in;
  public_key *pub;
  CBS *in_local;
  KYBER_public_key *public_key_local;
  
  orig_in.len = (size_t)anon_unknown.dwarf_217a0a::public_key_from_external(public_key);
  local_38 = (undefined1  [8])in->data;
  orig_in.data = (uint8_t *)in->len;
  iVar1 = kyber_parse_public_key_no_hash((public_key *)orig_in.len,in);
  if ((iVar1 != 0) && (sVar2 = CBS_len(in), sVar2 == 0)) {
    out = (uint8_t *)(orig_in.len + 0x620);
    in_00 = CBS_data((CBS *)local_38);
    sVar2 = CBS_len((CBS *)local_38);
    hash_h(out,in_00,sVar2);
    return 1;
  }
  return 0;
}

Assistant:

int KYBER_parse_public_key(struct KYBER_public_key *public_key, CBS *in) {
  struct public_key *pub = public_key_from_external(public_key);
  CBS orig_in = *in;
  if (!kyber_parse_public_key_no_hash(pub, in) ||  //
      CBS_len(in) != 0) {
    return 0;
  }
  hash_h(pub->public_key_hash, CBS_data(&orig_in), CBS_len(&orig_in));
  return 1;
}